

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::multiobjectiveSolve(Highs *this)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first;
  int iVar4;
  uint uVar5;
  bool bVar6;
  size_type sVar7;
  stringstream *psVar8;
  type pbVar9;
  reference pvVar10;
  undefined8 uVar11;
  Highs *this_00;
  reference pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  reference pvVar15;
  double *pdVar16;
  uint *puVar17;
  HighsLogOptions *log_options_;
  long in_RDI;
  char *pcVar18;
  HighsInt iEl;
  double upper_bound;
  double lower_bound;
  HighsStatus add_row_status;
  double objective;
  HighsInt iCol_4;
  HighsInt nnz;
  HighsStatus solve_status;
  HighsInt iCol_3;
  HighsStatus assess_primal_solution;
  bool feasible;
  bool integral;
  bool valid;
  HighsStatus set_solution_status;
  HighsLinearObjective *linear_objective_1;
  HighsInt iObj_4;
  HighsInt priority;
  HighsInt iIx;
  HighsSolution solution;
  vector<double,_std::allocator<double>_> value;
  vector<int,_std::allocator<int>_> index;
  HighsInt original_lp_num_row;
  HighsInt iObj_3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> priority_objective;
  HighsInt iCol_2;
  HighsInt iCol_1;
  HighsLinearObjective *multi_linear_objective_1;
  HighsInt iObj_2;
  HighsInt iCol;
  HighsLinearObjective *linear_objective;
  HighsInt iObj_1;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  multi_objective_log;
  HighsLinearObjective *multi_linear_objective;
  HighsInt iObj;
  HighsLp *lp;
  HighsInt num_linear_objective;
  HighsInt coeff_logging_size_limit;
  Highs *in_stack_00000cb8;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  Highs *in_stack_fffffffffffff8b0;
  Highs *in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8c0;
  int in_stack_fffffffffffff8c4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  HighsStatus in_stack_fffffffffffff8d4;
  HighsInt num_new_nz;
  type in_stack_fffffffffffff8e0;
  type in_stack_fffffffffffff8e8;
  Highs *in_stack_fffffffffffff8f0;
  type in_stack_fffffffffffff8f8;
  type in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  Highs *in_stack_fffffffffffff910;
  type in_stack_fffffffffffff928;
  type in_stack_fffffffffffff948;
  stringstream *in_stack_fffffffffffff950;
  HighsInt in_stack_fffffffffffff998;
  HighsStatus in_stack_fffffffffffff99c;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffff9a0;
  HighsStatus in_stack_fffffffffffff9a4;
  char *local_638;
  HighsSolution *solution_00;
  char *local_570;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [36];
  int local_43c;
  string local_438 [32];
  string local_418 [40];
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  Highs *local_3d0;
  Highs *local_3c8;
  HighsStatus local_3bc;
  double local_3b8;
  int local_3b0;
  int local_3ac;
  string local_3a8 [36];
  HighsStatus local_384;
  string local_380 [32];
  string local_360 [36];
  uint local_33c;
  string local_338 [32];
  string local_318 [40];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [36];
  HighsStatus local_28c;
  byte local_287;
  byte local_286;
  byte local_285;
  HighsStatus local_284;
  reference local_280;
  uint local_274;
  HighsStatus local_270;
  int local_26c;
  byte local_268;
  undefined1 local_1f9 [33];
  vector<int,_std::allocator<int>_> local_1d8;
  int local_1bc;
  undefined8 local_1b8;
  pair<int,_int> *local_1b0;
  pair<int,_int> *local_1a8;
  pair<int,_int> local_19c;
  int local_194;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_190;
  undefined4 local_174;
  string local_170 [32];
  uint local_12c;
  string local_128 [32];
  string local_108 [44];
  int local_dc;
  reference local_d8;
  int local_cc;
  undefined8 local_c8;
  string local_c0 [32];
  string local_a0 [36];
  uint local_7c;
  string local_78 [40];
  reference local_50;
  uint local_48;
  reference local_30;
  uint local_24;
  int *local_20;
  uint local_18;
  undefined4 local_14;
  HighsStatus local_4;
  
  local_14 = 10;
  sVar7 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::size
                    ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                     (in_RDI + 0x520));
  local_18 = (uint)sVar7;
  local_20 = (int *)(in_RDI + 0x138);
  for (local_24 = 0; (int)local_24 < (int)local_18; local_24 = local_24 + 1) {
    local_30 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::operator[]
                         ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                          (in_RDI + 0x520),(long)(int)local_24);
    sVar7 = std::vector<double,_std::allocator<double>_>::size(&local_30->coefficients);
    if (sVar7 != (long)*local_20) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Multiple linear objective coefficient vector %d has size incompatible with model\n"
                   ,(ulong)local_24);
      return kError;
    }
  }
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff8b0);
  pcVar18 = "using lexicographic optimization by priority";
  if ((*(byte *)(in_RDI + 0xcac) & 1) != 0) {
    pcVar18 = "blending objectives by weight";
  }
  highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
               "Solving with %d multiple linear objectives, %s\n",(ulong)local_18,pcVar18);
  pcVar18 = "";
  if (*local_20 < 10) {
    pcVar18 = "   coefficients";
  }
  highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
               "Ix      weight      offset     abs_tol     rel_tol    priority%s\n",pcVar18);
  for (local_48 = 0; (int)local_48 < (int)local_18; local_48 = local_48 + 1) {
    local_50 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::operator[]
                         ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                          (in_RDI + 0x520),(long)(int)local_48);
    psVar8 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar8);
    std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
    unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
              ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff8b0,
               (pointer)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8b0,
                (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
    pbVar9 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff8b0);
    highsFormatToString_abi_cxx11_
              ((char *)local_50->weight,local_50->offset,local_50->abs_tolerance,
               local_50->rel_tolerance,local_78,"%2d %11.6g %11.6g %11.6g %11.6g %11d  ",
               (ulong)local_48,(ulong)(uint)local_50->priority);
    std::operator<<((ostream *)(pbVar9 + 0x10),local_78);
    std::__cxx11::string::~string(local_78);
    if (*local_20 < 10) {
      for (local_7c = 0; (int)local_7c < *local_20; local_7c = local_7c + 1) {
        pbVar9 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff8b0);
        uVar5 = local_7c;
        pcVar18 = ",";
        if ((long)(int)local_7c == 0) {
          pcVar18 = "";
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_50->coefficients,(long)(int)local_7c);
        highsFormatToString_abi_cxx11_
                  ((char *)*pvVar10,local_a0,"%s c_{%1d} = %g",pcVar18,(ulong)uVar5);
        std::operator<<((ostream *)(pbVar9 + 0x10),local_a0);
        std::__cxx11::string::~string(local_a0);
      }
    }
    pbVar9 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff8b0);
    std::operator<<((ostream *)(pbVar9 + 0x10),"\n");
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x4e9827);
    std::__cxx11::stringstream::str();
    uVar11 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,"%s",uVar11);
    std::__cxx11::string::~string(local_c0);
  }
  clearSolver(in_stack_fffffffffffff8b0);
  if ((*(byte *)(in_RDI + 0xcac) & 1) == 0) {
    bVar6 = HighsModel::isQp((HighsModel *)(in_RDI + 0x138));
    if ((bVar6) && (1 < (int)local_18)) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Cannot perform non-trivial lexicographic optimization for QP\n");
      local_4 = kError;
      local_174 = 1;
    }
    else {
      bVar6 = hasRepeatedLinearObjectivePriorities
                        ((Highs *)in_stack_fffffffffffff8c8._M_current,
                         (HighsLinearObjective *)
                         CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      if (bVar6) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                     "Repeated priorities for lexicographic optimization is illegal\n");
        local_4 = kError;
        local_174 = 1;
      }
      else {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x4e9f28);
        for (local_194 = 0; local_194 < (int)local_18; local_194 = local_194 + 1) {
          std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::operator[]
                    ((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                     (in_RDI + 0x520),(long)local_194);
          local_19c = std::make_pair<int&,int&>
                                ((int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8
                                                ),(int *)0x4e9f77);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_fffffffffffff8b0,
                     (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        }
        local_1a8 = (pair<int,_int> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        local_1b0 = (pair<int,_int> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        __first._M_current._4_4_ = in_stack_fffffffffffff8d4;
        __first._M_current._0_4_ = in_stack_fffffffffffff8d0;
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,bool(*)(std::pair<int,int>,std::pair<int,int>)>
                  (__first,in_stack_fffffffffffff8c8,
                   (_func_bool_pair<int,_int>_pair<int,_int> *)
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        local_20[0x3e] = 0;
        local_20[0x3f] = 0;
        local_1b8 = 0;
        std::vector<double,_std::allocator<double>_>::assign
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0,
                   CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                   (value_type_conflict1 *)0x4ea067);
        local_1bc = local_20[1];
        this_00 = (Highs *)(long)*local_20;
        std::allocator<int>::allocator((allocator<int> *)0x4ea0a3);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (size_type)in_stack_fffffffffffff8c8._M_current,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::allocator<int>::~allocator((allocator<int> *)0x4ea0cf);
        solution_00 = (HighsSolution *)local_1f9;
        std::allocator<double>::allocator((allocator<double> *)0x4ea0f7);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (size_type)in_stack_fffffffffffff8c8._M_current,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::allocator<double>::~allocator((allocator<double> *)0x4ea123);
        HighsSolution::HighsSolution((HighsSolution *)in_stack_fffffffffffff8b0);
        for (local_26c = 0; local_26c < (int)local_18; local_26c = local_26c + 1) {
          pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[](&local_190,(long)local_26c);
          local_270 = pvVar12->first;
          pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[](&local_190,(long)local_26c);
          local_274 = pvVar12->second;
          local_280 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::
                      operator[]((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                                  *)(in_RDI + 0x520),(long)(int)local_274);
          *(double *)(local_20 + 0x3e) = local_280->offset;
          std::vector<double,_std::allocator<double>_>::operator=
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff950,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff948);
          bVar6 = 0.0 < local_280->weight;
          local_20[0x3c] = (bVar6 - 1) + (uint)bVar6;
          bVar6 = HighsLp::isMip((HighsLp *)in_stack_fffffffffffff8b8);
          if ((bVar6) && ((local_268 & 1) != 0)) {
            local_284 = setSolution(this_00,solution_00);
            if (local_284 == kError) {
              highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                           "Failure to use one MIP to provide an integer feasible solution of the next\n"
                          );
              local_4 = returnFromLexicographicOptimization
                                  ((Highs *)CONCAT44(in_stack_fffffffffffff9a4,
                                                     in_stack_fffffffffffff9a0),
                                   in_stack_fffffffffffff99c,in_stack_fffffffffffff998);
              goto LAB_004eb473;
            }
            local_28c = assessPrimalSolution
                                  (in_stack_fffffffffffff910,(bool *)in_stack_fffffffffffff908,
                                   (bool *)in_stack_fffffffffffff900,
                                   (bool *)in_stack_fffffffffffff8f8);
            if ((((local_285 & 1) == 0) || ((local_286 & 1) == 0)) || ((local_287 & 1) == 0)) {
              highsBoolToString_abi_cxx11_
                        (SUB81((ulong)in_stack_fffffffffffff928 >> 0x38,0),
                         (HighsInt)in_stack_fffffffffffff928);
              uVar11 = std::__cxx11::string::c_str();
              highsBoolToString_abi_cxx11_
                        (SUB81((ulong)in_stack_fffffffffffff928 >> 0x38,0),
                         (HighsInt)in_stack_fffffffffffff928);
              uVar13 = std::__cxx11::string::c_str();
              highsBoolToString_abi_cxx11_
                        (SUB81((ulong)in_stack_fffffffffffff928 >> 0x38,0),
                         (HighsInt)in_stack_fffffffffffff928);
              uVar14 = std::__cxx11::string::c_str();
              highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                           "Failure to use one MIP to provide an integer feasible solution of the next: status is valid = %s, integral = %s, feasible = %s\n"
                           ,uVar11,uVar13,uVar14);
              std::__cxx11::string::~string(local_2f0);
              std::__cxx11::string::~string(local_2d0);
              std::__cxx11::string::~string(local_2b0);
            }
          }
          psVar8 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar8);
          std::
          unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
          unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
                    ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff8b0,
                     (pointer)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          std::
          unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff8b0,
                      (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          std::
          unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          pbVar9 = std::
                   unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff8b0);
          highsFormatToString_abi_cxx11_
                    ((char *)local_318,"Solving with objective %d",(ulong)local_274);
          std::operator<<((ostream *)(pbVar9 + 0x10),local_318);
          std::__cxx11::string::~string(local_318);
          if (*local_20 < 10) {
            pbVar9 = std::
                     unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffff8b0);
            if (local_20[0x3c] == 1) {
              local_638 = "min";
            }
            else {
              local_638 = "max";
            }
            highsFormatToString_abi_cxx11_
                      (*(char **)(local_20 + 0x3e),local_338,": %s %g",local_638);
            std::operator<<((ostream *)(pbVar9 + 0x10),local_338);
            std::__cxx11::string::~string(local_338);
            for (local_33c = 0; (int)local_33c < *local_20; local_33c = local_33c + 1) {
              pbVar9 = std::
                       unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)in_stack_fffffffffffff8b0);
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(local_20 + 2),
                                   (long)(int)local_33c);
              highsFormatToString_abi_cxx11_
                        ((char *)*pvVar10,local_360," + (%g) x[%d]",(ulong)local_33c);
              std::operator<<((ostream *)(pbVar9 + 0x10),local_360);
              std::__cxx11::string::~string(local_360);
            }
          }
          pbVar9 = std::
                   unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff8b0);
          std::operator<<((ostream *)(pbVar9 + 0x10),"\n");
          std::
          unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x4ea873);
          std::__cxx11::stringstream::str();
          uVar11 = std::__cxx11::string::c_str();
          highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,"%s",uVar11);
          std::__cxx11::string::~string(local_380);
          in_stack_fffffffffffff9a4 = solve(in_stack_00000cb8);
          local_384 = in_stack_fffffffffffff9a4;
          if (in_stack_fffffffffffff9a4 == kError) {
            local_4 = returnFromLexicographicOptimization
                                ((Highs *)CONCAT44(0xffffffff,in_stack_fffffffffffff9a0),
                                 in_stack_fffffffffffff99c,in_stack_fffffffffffff998);
            goto LAB_004eb473;
          }
          if (*(int *)(in_RDI + 0x1244) != 7) {
            return_status = local_270;
            modelStatusToString_abi_cxx11_
                      (in_stack_fffffffffffff8b8,
                       (HighsModelStatus)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
            uVar11 = std::__cxx11::string::c_str();
            highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                         "After priority %d solve, model status is %s\n",(ulong)(uint)return_status,
                         uVar11);
            std::__cxx11::string::~string(local_3a8);
            local_4 = returnFromLexicographicOptimization
                                ((Highs *)CONCAT44(in_stack_fffffffffffff9a4,
                                                   in_stack_fffffffffffff9a0),return_status,
                                 in_stack_fffffffffffff998);
            goto LAB_004eb473;
          }
          if (local_26c == local_18 - 1) break;
          bVar6 = HighsLp::isMip((HighsLp *)in_stack_fffffffffffff8b8);
          if (bVar6) {
            std::vector<double,_std::allocator<double>_>::operator=
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff950,
                       (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff948);
            local_268 = 1;
          }
          local_3ac = 0;
          for (local_3b0 = 0; local_3b0 < *local_20; local_3b0 = local_3b0 + 1) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(local_20 + 2),
                                 (long)local_3b0);
            iVar4 = local_3b0;
            if ((*pvVar10 != 0.0) || (NAN(*pvVar10))) {
              pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_1d8,(long)local_3ac);
              *pvVar15 = iVar4;
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(local_20 + 2),
                                   (long)local_3b0);
              vVar3 = *pvVar10;
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(local_1f9 + 1),
                                   (long)local_3ac);
              *pvVar10 = vVar3;
              local_3ac = local_3ac + 1;
            }
          }
          local_3b8 = *(double *)(in_RDI + 0xee0);
          local_3c8 = (Highs *)0xfff0000000000000;
          local_3d0 = (Highs *)0x7ff0000000000000;
          if (local_20[0x3c] == 1) {
            if (0.0 <= local_280->abs_tolerance) {
              local_3d0 = (Highs *)(local_3b8 + local_280->abs_tolerance);
            }
            if (0.0 <= local_280->rel_tolerance) {
              if (local_3b8 < 0.0) {
                if (local_3b8 < 0.0) {
                  local_3e0 = local_3b8 * (1.0 - local_280->rel_tolerance);
                  pdVar16 = std::min<double>(&local_3e0,(double *)&local_3d0);
                  local_3d0 = (Highs *)*pdVar16;
                }
              }
              else {
                local_3d8 = local_3b8 * (local_280->rel_tolerance + 1.0);
                pdVar16 = std::min<double>(&local_3d8,(double *)&local_3d0);
                local_3d0 = (Highs *)*pdVar16;
              }
            }
            local_3d0 = (Highs *)((double)local_3d0 - *(double *)(local_20 + 0x3e));
          }
          else {
            if (0.0 <= local_280->abs_tolerance) {
              local_3c8 = (Highs *)(local_3b8 - local_280->abs_tolerance);
            }
            if (0.0 <= local_280->rel_tolerance) {
              if (local_3b8 < 0.0) {
                if (local_3b8 < 0.0) {
                  local_3f0 = local_3b8 * (local_280->rel_tolerance + 1.0);
                  pdVar16 = std::max<double>(&local_3f0,(double *)&local_3c8);
                  local_3c8 = (Highs *)*pdVar16;
                }
              }
              else {
                local_3e8 = local_3b8 * (1.0 - local_280->rel_tolerance);
                pdVar16 = std::max<double>(&local_3e8,(double *)&local_3c8);
                local_3c8 = (Highs *)*pdVar16;
              }
            }
            local_3c8 = (Highs *)((double)local_3c8 - *(double *)(local_20 + 0x3e));
          }
          if ((((double)local_3c8 == -INFINITY) && (!NAN((double)local_3c8))) &&
             (((double)local_3d0 == INFINITY && (!NAN((double)local_3d0))))) {
            highsLogUser((HighsLogOptions *)local_280->abs_tolerance,
                         (HighsLogType)local_280->rel_tolerance,(char *)(in_RDI + 0xe28),4,
                         "After priority %d solve, no objective constraint due to absolute tolerance being %g < 0, and relative tolerance being %g < 0\n"
                         ,(ulong)(uint)local_270);
          }
          in_stack_fffffffffffff950 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(in_stack_fffffffffffff950);
          std::
          unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
          unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
                    ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff8b0,
                     (pointer)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          std::
          unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff8b0,
                      (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
          std::
          unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          in_stack_fffffffffffff948 =
               std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff8b0);
          pbVar9 = in_stack_fffffffffffff948 + 0x10;
          highsFormatToString_abi_cxx11_
                    ((char *)local_418,"Add constraint for objective %d: ",(ulong)local_274);
          std::operator<<((ostream *)pbVar9,local_418);
          std::__cxx11::string::~string(local_418);
          if (local_3ac < 10) {
            in_stack_fffffffffffff928 =
                 std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff8b0);
            pbVar9 = in_stack_fffffffffffff928 + 0x10;
            highsFormatToString_abi_cxx11_((char *)local_3c8,local_438,"%g <= ");
            std::operator<<((ostream *)pbVar9,local_438);
            std::__cxx11::string::~string(local_438);
            for (local_43c = 0; local_43c < local_3ac; local_43c = local_43c + 1) {
              in_stack_fffffffffffff900 =
                   std::
                   unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff8b0);
              in_stack_fffffffffffff900 = in_stack_fffffffffffff900 + 0x10;
              in_stack_fffffffffffff908 = "";
              if (0 < (long)local_43c) {
                in_stack_fffffffffffff908 = " + ";
              }
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(local_1f9 + 1),
                                   (long)local_43c);
              in_stack_fffffffffffff910 = (Highs *)*pvVar10;
              puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                          (&local_1d8,(long)local_43c);
              highsFormatToString_abi_cxx11_
                        ((char *)in_stack_fffffffffffff910,local_460,"%s(%g) x[%d]",
                         in_stack_fffffffffffff908,(ulong)*puVar17);
              std::operator<<((ostream *)in_stack_fffffffffffff900,local_460);
              std::__cxx11::string::~string(local_460);
            }
            in_stack_fffffffffffff8f8 =
                 std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff8b0);
            in_stack_fffffffffffff8f0 = (Highs *)(in_stack_fffffffffffff8f8 + 0x10);
            highsFormatToString_abi_cxx11_((char *)local_3d0,local_480," <= %g\n");
            std::operator<<((ostream *)in_stack_fffffffffffff8f0,local_480);
            std::__cxx11::string::~string(local_480);
          }
          else {
            in_stack_fffffffffffff8e8 =
                 std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff8b0);
            in_stack_fffffffffffff8e0 = in_stack_fffffffffffff8e8 + 0x10;
            highsFormatToString_abi_cxx11_
                      ((char *)local_3c8,local_3d0,local_4a0,"Bounds [%g, %g]\n");
            std::operator<<((ostream *)in_stack_fffffffffffff8e0,local_4a0);
            std::__cxx11::string::~string(local_4a0);
          }
          log_options_ = (HighsLogOptions *)(in_RDI + 0xe28);
          std::
          unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x4eb341);
          std::__cxx11::stringstream::str();
          uVar11 = std::__cxx11::string::c_str();
          highsLogUser(log_options_,kInfo,"%s",uVar11);
          num_new_nz = (HighsInt)((ulong)log_options_ >> 0x20);
          std::__cxx11::string::~string(local_4c0);
          in_stack_fffffffffffff8b0 = local_3c8;
          in_stack_fffffffffffff8b8 = local_3d0;
          in_stack_fffffffffffff8c4 = local_3ac;
          pdVar16 = (double *)
                    std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0x4eb3c0);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x4eb3d2);
          in_stack_fffffffffffff8d4 =
               addRow(in_stack_fffffffffffff8f0,(double)in_stack_fffffffffffff8e8,
                      (double)in_stack_fffffffffffff8e0,num_new_nz,
                      (HighsInt *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                      pdVar16);
          local_3bc = in_stack_fffffffffffff8d4;
        }
        local_4 = returnFromLexicographicOptimization
                            ((Highs *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                             in_stack_fffffffffffff99c,in_stack_fffffffffffff998);
LAB_004eb473:
        local_174 = 1;
        HighsSolution::~HighsSolution((HighsSolution *)in_stack_fffffffffffff8b0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      }
    }
  }
  else {
    local_20[0x3e] = 0;
    local_20[0x3f] = 0;
    local_c8 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0,
               CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (value_type_conflict1 *)0x4e9911);
    for (local_cc = 0; local_cc < (int)local_18; local_cc = local_cc + 1) {
      local_d8 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::
                 operator[]((vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_> *)
                            (in_RDI + 0x520),(long)local_cc);
      *(double *)(local_20 + 0x3e) =
           local_d8->weight * local_d8->offset + *(double *)(local_20 + 0x3e);
      for (local_dc = 0; local_dc < *local_20; local_dc = local_dc + 1) {
        dVar1 = local_d8->weight;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&local_d8->coefficients,(long)local_dc);
        dVar2 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_20 + 2),
                             (long)local_dc);
        *pvVar10 = dVar1 * dVar2 + *pvVar10;
      }
    }
    local_20[0x3c] = 1;
    psVar8 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar8);
    std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
    unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
              ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff8b0,
               (pointer)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8b0,
                (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
    pbVar9 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff8b0);
    highsFormatToString_abi_cxx11_((char *)local_108,"Solving with blended objective");
    std::operator<<((ostream *)(pbVar9 + 0x10),local_108);
    std::__cxx11::string::~string(local_108);
    if (*local_20 < 10) {
      pbVar9 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff8b0);
      if (local_20[0x3c] == 1) {
        local_570 = "min";
      }
      else {
        local_570 = "max";
      }
      highsFormatToString_abi_cxx11_(*(char **)(local_20 + 0x3e),local_128,": %s %g",local_570);
      std::operator<<((ostream *)(pbVar9 + 0x10),local_128);
      std::__cxx11::string::~string(local_128);
      for (local_12c = 0; (int)local_12c < *local_20; local_12c = local_12c + 1) {
        pbVar9 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff8b0);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_20 + 2),
                             (long)(int)local_12c);
        highsFormatToString_abi_cxx11_
                  ((char *)*pvVar10,&stack0xfffffffffffffeb0," + (%g) x[%d]",(ulong)local_12c);
        std::operator<<((ostream *)(pbVar9 + 0x10),(string *)&stack0xfffffffffffffeb0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
      }
    }
    pbVar9 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff8b0);
    std::operator<<((ostream *)(pbVar9 + 0x10),"\n");
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x4e9dac);
    std::__cxx11::stringstream::str();
    uVar11 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,"%s",uVar11);
    std::__cxx11::string::~string(local_170);
    local_4 = solve(in_stack_00000cb8);
    local_174 = 1;
  }
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
  return local_4;
}

Assistant:

HighsStatus Highs::multiobjectiveSolve() {
  const HighsInt coeff_logging_size_limit = 10;
  HighsInt num_linear_objective = this->multi_linear_objective_.size();

  assert(num_linear_objective > 0);
  HighsLp& lp = this->model_.lp_;
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsLinearObjective& multi_linear_objective =
        this->multi_linear_objective_[iObj];
    if (multi_linear_objective.coefficients.size() !=
        static_cast<size_t>(lp.num_col_)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Multiple linear objective coefficient vector %d has size "
                   "incompatible with model\n",
                   int(iObj));
      return HighsStatus::kError;
    }
  }

  std::unique_ptr<std::stringstream> multi_objective_log;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Solving with %d multiple linear objectives, %s\n",
               int(num_linear_objective),
               this->options_.blend_multi_objectives
                   ? "blending objectives by weight"
                   : "using lexicographic optimization by priority");
  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Ix      weight      offset     abs_tol     rel_tol    priority%s\n",
      lp.num_col_ < coeff_logging_size_limit ? "   coefficients" : "");
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsLinearObjective& linear_objective =
        this->multi_linear_objective_[iObj];
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "%2d %11.6g %11.6g %11.6g %11.6g %11d  ", int(iObj),
        linear_objective.weight, linear_objective.offset,
        linear_objective.abs_tolerance, linear_objective.rel_tolerance,
        linear_objective.priority);
    if (lp.num_col_ < coeff_logging_size_limit) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            "%s c_{%1d} = %g", iCol == 0 ? "" : ",", int(iCol),
            linear_objective.coefficients[iCol]);
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
  }
  this->clearSolver();
  if (this->options_.blend_multi_objectives) {
    // Objectives are blended by weight and minimized
    lp.offset_ = 0;
    lp.col_cost_.assign(lp.num_col_, 0);
    for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
      HighsLinearObjective& multi_linear_objective =
          this->multi_linear_objective_[iObj];
      lp.offset_ +=
          multi_linear_objective.weight * multi_linear_objective.offset;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        lp.col_cost_[iCol] += multi_linear_objective.weight *
                              multi_linear_objective.coefficients[iCol];
    }
    lp.sense_ = ObjSense::kMinimize;

    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "Solving with blended objective");
    if (lp.num_col_ < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString(
          ": %s %g", lp.sense_ == ObjSense::kMinimize ? "min" : "max",
          lp.offset_);
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            " + (%g) x[%d]", lp.col_cost_[iCol], int(iCol));
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    return this->solve();
  }

  // Objectives are applied lexicographically
  if (model_.isQp() && num_linear_objective > 1) {
    // Lexicographic optimization with a single linear objective is
    // trivially standard optimization, so is OK
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Cannot perform non-trivial lexicographic optimization for QP\n");
    return HighsStatus::kError;
  }
  // Check whether there are repeated linear objective priorities
  if (hasRepeatedLinearObjectivePriorities()) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Repeated priorities for lexicographic optimization is illegal\n");
    return HighsStatus::kError;
  }
  std::vector<std::pair<HighsInt, HighsInt>> priority_objective;

  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++)
    priority_objective.push_back(
        std::make_pair(this->multi_linear_objective_[iObj].priority, iObj));
  std::sort(priority_objective.begin(), priority_objective.end(), comparison);
  // Clear LP objective
  lp.offset_ = 0;
  lp.col_cost_.assign(lp.num_col_, 0);
  const HighsInt original_lp_num_row = lp.num_row_;
  std::vector<HighsInt> index(lp.num_col_);
  std::vector<double> value(lp.num_col_);
  // Use the solution of one MIP to provide an integer feasible
  // solution of the next
  HighsSolution solution;
  for (HighsInt iIx = 0; iIx < num_linear_objective; iIx++) {
    HighsInt priority = priority_objective[iIx].first;
    HighsInt iObj = priority_objective[iIx].second;
    // Use this objective
    HighsLinearObjective& linear_objective =
        this->multi_linear_objective_[iObj];
    lp.offset_ = linear_objective.offset;
    lp.col_cost_ = linear_objective.coefficients;
    lp.sense_ =
        linear_objective.weight > 0 ? ObjSense::kMinimize : ObjSense::kMaximize;
    if (lp.isMip() && solution.value_valid) {
      HighsStatus set_solution_status = this->setSolution(solution);
      if (set_solution_status == HighsStatus::kError) {
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "Failure to use one MIP to provide an integer feasible "
                     "solution of the next\n");
        return returnFromLexicographicOptimization(HighsStatus::kError,
                                                   original_lp_num_row);
      }
      bool valid, integral, feasible;
      HighsStatus assess_primal_solution =
          assessPrimalSolution(valid, integral, feasible);
      if (!valid || !integral || !feasible) {
        highsLogUser(options_.log_options, HighsLogType::kWarning,
                     "Failure to use one MIP to provide an integer feasible "
                     "solution of the next: "
                     "status is valid = %s, integral = %s, feasible = %s\n",
                     highsBoolToString(valid).c_str(),
                     highsBoolToString(integral).c_str(),
                     highsBoolToString(feasible).c_str());
      }
    }
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString("Solving with objective %d",
                                                int(iObj));
    if (lp.num_col_ < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString(
          ": %s %g", lp.sense_ == ObjSense::kMinimize ? "min" : "max",
          lp.offset_);
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            " + (%g) x[%d]", lp.col_cost_[iCol], int(iCol));
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    HighsStatus solve_status = this->solve();
    if (solve_status == HighsStatus::kError)
      return returnFromLexicographicOptimization(HighsStatus::kError,
                                                 original_lp_num_row);
    if (model_status_ != HighsModelStatus::kOptimal) {
      highsLogUser(options_.log_options, HighsLogType::kWarning,
                   "After priority %d solve, model status is %s\n",
                   int(priority), modelStatusToString(model_status_).c_str());
      return returnFromLexicographicOptimization(HighsStatus::kWarning,
                                                 original_lp_num_row);
    }
    if (iIx == num_linear_objective - 1) break;
    if (lp.isMip()) {
      // Save the solution to provide an integer feasible solution of
      // the next MIP
      solution.col_value = this->solution_.col_value;
      solution.value_valid = true;
    }
    // Add the constraint
    HighsInt nnz = 0;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.col_cost_[iCol]) {
        index[nnz] = iCol;
        value[nnz] = lp.col_cost_[iCol];
        nnz++;
      }
    }
    double objective = info_.objective_function_value;
    HighsStatus add_row_status;
    double lower_bound = -kHighsInf;
    double upper_bound = kHighsInf;
    if (lp.sense_ == ObjSense::kMinimize) {
      // Minimizing, so set a greater upper bound than the objective
      if (linear_objective.abs_tolerance >= 0)
        upper_bound = objective + linear_objective.abs_tolerance;
      if (linear_objective.rel_tolerance >= 0) {
        if (objective >= 0) {
          // Guarantees objective of at least (1+t).f^*
          //
          // so ((1+t).f^*-f^*)/f^* = t
          upper_bound = std::min(
              objective * (1.0 + linear_objective.rel_tolerance), upper_bound);
        } else if (objective < 0) {
          // Guarantees objective of at least (1-t).f^*
          //
          // so ((1-t).f^*-f^*)/f^* = -t
          upper_bound = std::min(
              objective * (1.0 - linear_objective.rel_tolerance), upper_bound);
        }
      }
      upper_bound -= lp.offset_;
    } else {
      // Maximizing, so set a lesser lower bound than the objective
      if (linear_objective.abs_tolerance >= 0)
        lower_bound = objective - linear_objective.abs_tolerance;
      if (linear_objective.rel_tolerance >= 0) {
        if (objective >= 0) {
          // Guarantees objective of at most (1-t).f^*
          //
          // so ((1-t).f^*-f^*)/f^* = -t
          lower_bound = std::max(
              objective * (1.0 - linear_objective.rel_tolerance), lower_bound);
        } else if (objective < 0) {
          // Guarantees objective of at least (1+t).f^*
          //
          // so ((1+t).f^*-f^*)/f^* = t
          lower_bound = std::max(
              objective * (1.0 + linear_objective.rel_tolerance), lower_bound);
        }
      }
      lower_bound -= lp.offset_;
    }
    if (lower_bound == -kHighsInf && upper_bound == kHighsInf)
      highsLogUser(options_.log_options, HighsLogType::kWarning,
                   "After priority %d solve, no objective constraint due to "
                   "absolute tolerance being %g < 0,"
                   " and relative tolerance being %g < 0\n",
                   int(priority), linear_objective.abs_tolerance,
                   linear_objective.rel_tolerance);
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "Add constraint for objective %d: ", int(iObj));
    if (nnz < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString("%g <= ", lower_bound);
      for (HighsInt iEl = 0; iEl < nnz; iEl++)
        *multi_objective_log << highsFormatToString(
            "%s(%g) x[%d]", iEl > 0 ? " + " : "", value[iEl], int(index[iEl]));
      *multi_objective_log << highsFormatToString(" <= %g\n", upper_bound);
    } else {
      *multi_objective_log << highsFormatToString("Bounds [%g, %g]\n",
                                                  lower_bound, upper_bound);
    }
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    add_row_status =
        this->addRow(lower_bound, upper_bound, nnz, index.data(), value.data());
    assert(add_row_status == HighsStatus::kOk);
  }
  return returnFromLexicographicOptimization(HighsStatus::kOk,
                                             original_lp_num_row);
}